

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

void CMU462::DynamicScene::drawCube(void)

{
  glBegin(7);
  glVertex3f(0x3f800000,0x3f800000,0xbf800000);
  glVertex3f(0xbf800000,0x3f800000);
  glVertex3f(0xbf800000,0x3f800000);
  glVertex3f(0x3f800000,0x3f800000);
  glVertex3f(0x3f800000,0xbf800000);
  glVertex3f(0xbf800000,0xbf800000,0x3f800000);
  glVertex3f(0xbf800000,0xbf800000);
  glVertex3f(0x3f800000,0xbf800000);
  glVertex3f(0x3f800000,0x3f800000);
  glVertex3f(0xbf800000,0x3f800000);
  glVertex3f(0xbf800000,0xbf800000,0x3f800000);
  glVertex3f(0x3f800000,0xbf800000);
  glVertex3f(0x3f800000,0xbf800000);
  glVertex3f(0xbf800000,0xbf800000);
  glVertex3f(0xbf800000,0x3f800000);
  glVertex3f(0x3f800000,0x3f800000,0xbf800000);
  glVertex3f(0xbf800000,0x3f800000);
  glVertex3f(0xbf800000,0x3f800000);
  glVertex3f(0xbf800000,0xbf800000);
  glVertex3f(0xbf800000,0xbf800000,0x3f800000);
  glVertex3f(0x3f800000,0x3f800000,0xbf800000);
  glVertex3f(0x3f800000,0x3f800000);
  glVertex3f(0x3f800000,0xbf800000);
  glVertex3f(0x3f800000,0xbf800000);
  glEnd();
  return;
}

Assistant:

void drawCube()
  {
    glBegin(GL_QUADS);

    glVertex3f(1.0, 1.0, -1.0);
    glVertex3f(-1.0, 1.0, -1.0);
    glVertex3f(-1.0, 1.0, 1.0);
    glVertex3f(1.0, 1.0, 1.0);

    glVertex3f(1.0, -1.0, 1.0);
    glVertex3f(-1.0, -1.0, 1.0);
    glVertex3f(-1.0, -1.0, -1.0);
    glVertex3f(1.0, -1.0, -1.0);

    glVertex3f(1.0, 1.0, 1.0);
    glVertex3f(-1.0, 1.0, 1.0);
    glVertex3f(-1.0, -1.0, 1.0);
    glVertex3f(1.0, -1.0, 1.0);

    glVertex3f(1.0, -1.0, -1.0);
    glVertex3f(-1.0, -1.0, -1.0);
    glVertex3f(-1.0, 1.0, -1.0);
    glVertex3f(1.0, 1.0, -1.0);

    glVertex3f(-1.0, 1.0, 1.0);
    glVertex3f(-1.0, 1.0, -1.0);
    glVertex3f(-1.0, -1.0, -1.0);
    glVertex3f(-1.0, -1.0, 1.0);

    glVertex3f(1.0, 1.0, -1.0);
    glVertex3f(1.0, 1.0, 1.0);
    glVertex3f(1.0, -1.0, 1.0);
    glVertex3f(1.0, -1.0, -1.0);

    glEnd();
  }